

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

Type * soul::SanityCheckPass::PostResolutionChecks::getDataTypeOfArrayRefLHS
                 (Type *__return_storage_ptr__,ASTObject *o)

{
  bool bVar1;
  Expression *pEVar2;
  EndpointDeclaration *pEVar3;
  EndpointDetails *pEVar4;
  reference pvVar5;
  vector<soul::Type,_std::allocator<soul::Type>_> local_78;
  pool_ptr<soul::AST::EndpointDeclaration> local_60;
  pool_ptr<soul::AST::EndpointDeclaration> endpoint;
  pool_ptr<soul::AST::Expression> e_1;
  vector<soul::Type,_std::allocator<soul::Type>_> local_48;
  pool_ptr<soul::AST::EndpointDeclaration> local_20;
  pool_ptr<soul::AST::EndpointDeclaration> e;
  ASTObject *o_local;
  
  e.object = (EndpointDeclaration *)o;
  cast<soul::AST::EndpointDeclaration,soul::AST::ASTObject>((soul *)&local_20,o);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_20);
  if (bVar1) {
    pEVar3 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_20);
    bVar1 = AST::EndpointDeclaration::isResolved(pEVar3);
    if (!bVar1) goto LAB_00467441;
    pEVar3 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_20);
    pEVar4 = AST::EndpointDeclaration::getDetails(pEVar3);
    AST::EndpointDetails::getSampleArrayTypes(&local_48,pEVar4);
    pvVar5 = std::vector<soul::Type,_std::allocator<soul::Type>_>::front(&local_48);
    Type::Type(__return_storage_ptr__,pvVar5);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_48);
    bVar1 = true;
  }
  else {
LAB_00467441:
    bVar1 = false;
  }
  pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_20);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  cast<soul::AST::Expression,soul::AST::ASTObject>((soul *)&endpoint,&(e.object)->super_ASTObject);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&endpoint);
  if (!bVar1) {
    bVar1 = false;
    goto LAB_004675f1;
  }
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->((pool_ptr<soul::AST::Expression> *)&endpoint)
  ;
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[8])(&local_60);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_60);
  if (bVar1) {
    pEVar3 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_60);
    bVar1 = AST::EndpointDeclaration::isResolved(pEVar3);
    if (!bVar1) goto LAB_00467595;
    pEVar3 = pool_ptr<soul::AST::EndpointDeclaration>::operator->(&local_60);
    pEVar4 = AST::EndpointDeclaration::getDetails(pEVar3);
    AST::EndpointDetails::getSampleArrayTypes(&local_78,pEVar4);
    pvVar5 = std::vector<soul::Type,_std::allocator<soul::Type>_>::front(&local_78);
    Type::Type(__return_storage_ptr__,pvVar5);
    std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_78);
    bVar1 = true;
  }
  else {
LAB_00467595:
    bVar1 = false;
  }
  pool_ptr<soul::AST::EndpointDeclaration>::~pool_ptr(&local_60);
  if (!bVar1) {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->
                       ((pool_ptr<soul::AST::Expression> *)&endpoint);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(__return_storage_ptr__);
    bVar1 = true;
  }
LAB_004675f1:
  pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&endpoint);
  if (!bVar1) {
    memset(__return_storage_ptr__,0,0x18);
    Type::Type(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static Type getDataTypeOfArrayRefLHS (AST::ASTObject& o)
        {
            if (auto e = cast<AST::EndpointDeclaration> (o))
                if (e->isResolved())
                    return e->getDetails().getSampleArrayTypes().front();

            if (auto e = cast<AST::Expression> (o))
            {
                if (auto endpoint = e->getAsEndpoint())
                    if (endpoint->isResolved())
                        return endpoint->getDetails().getSampleArrayTypes().front();

                return e->getResultType();
            }

            return {};
        }